

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::CommissionerApp::GetActiveTimestamp
          (Error *__return_storage_ptr__,CommissionerApp *this,Timestamp *aTimestamp)

{
  int iVar1;
  char *pcVar2;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  string local_a0;
  ErrorCode local_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  format_string_checker<char> local_58;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  iVar1 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])(this);
  if ((char)iVar1 == '\0') {
    local_58.types_[0] = none_type;
    local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "the commissioner is not active";
    local_58.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
    local_58.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_58.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_58.parse_funcs_[0] = (parse_func)0x0;
    begin = "the commissioner is not active";
    local_58.context_.types_ = local_58.types_;
    do {
      pcVar2 = begin + 1;
      if (*begin == '}') {
        if ((pcVar2 == "") || (*pcVar2 != '}')) {
          fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar2 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar2 = fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",&local_58);
      }
      begin = pcVar2;
    } while (pcVar2 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_58;
    fmt::v10::vformat_abi_cxx11_(&local_a0,(v10 *)0x22bb54,(string_view)ZEXT816(0x1e),args);
    local_80 = kInvalidState;
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,local_a0._M_dataplus._M_p,
               local_a0._M_dataplus._M_p + local_a0._M_string_length);
    __return_storage_ptr__->mCode = local_80;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_78);
    if (local_78[0] != local_68) {
      operator_delete(local_78[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
  }
  else {
    if (-1 < (short)(this->mActiveDataset).mPresentFlags) {
      abort();
    }
    *aTimestamp = (this->mActiveDataset).mActiveTimestamp;
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::GetActiveTimestamp(Timestamp &aTimestamp) const
{
    Error error;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    VerifyOrDie(mActiveDataset.mPresentFlags & ActiveOperationalDataset::kActiveTimestampBit);
    aTimestamp = mActiveDataset.mActiveTimestamp;

exit:
    return error;
}